

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cDrawIndirectTests.cpp
# Opt level: O1

long __thiscall
glcts::(anonymous_namespace)::DrawIndirectBase::BuffersCompare<tcu::Vector<float,4>>
          (DrawIndirectBase *this,
          vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *bufferTest,
          uint widthTest,uint heightTest,
          vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *bufferRef,
          uint widthRef,uint heightRef)

{
  pointer pVVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  double dVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar14;
  uint uVar15;
  bool bVar16;
  bool bVar17;
  float fVar18;
  double dVar19;
  DIResult status;
  float local_38c [3];
  ulong local_380;
  double local_378;
  double local_370;
  ulong local_368;
  ulong local_360;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined1 local_338 [8];
  ostream local_330;
  undefined1 local_1b8 [384];
  ulong local_38;
  ulong uVar13;
  
  lVar7 = (**(code **)(**(long **)(*(long *)(this + 0x20) + 8) + 0x20))();
  bVar2 = *(byte *)(lVar7 + 8);
  bVar3 = *(byte *)(lVar7 + 0xc);
  uVar12 = 1 << (*(byte *)(lVar7 + 0x10) & 0x1f);
  uVar13 = (ulong)uVar12;
  bVar4 = *(byte *)(lVar7 + 0x14);
  if (heightTest != 0) {
    local_360 = (ulong)widthTest;
    dVar19 = (double)widthRef / (double)local_360;
    local_378 = (double)heightRef / (double)heightTest;
    uVar9 = 0;
    local_380 = (ulong)heightTest;
    local_370 = dVar19;
    do {
      dVar5 = (double)(uVar9 & 0xffffffff) * local_378;
      bVar17 = widthTest != 0;
      if (widthTest != 0) {
        uVar10 = (ulong)((int)uVar9 * widthTest);
        uVar11 = 0;
        local_368 = uVar10;
        do {
          uVar14 = (int)uVar10 + (int)uVar11;
          pVVar1 = (bufferTest->
                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   )._M_impl.super__Vector_impl_data._M_start + uVar14;
          local_348 = *(undefined8 *)pVVar1->m_data;
          uStack_340 = *(undefined8 *)(pVVar1->m_data + 2);
          uVar15 = (int)((double)(uVar11 & 0xffffffff) * dVar19 + 0.5) +
                   (int)(dVar5 + 0.5) * widthRef;
          pVVar1 = (bufferRef->
                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   )._M_impl.super__Vector_impl_data._M_start + uVar15;
          local_358 = *(undefined8 *)pVVar1->m_data;
          uStack_350 = *(undefined8 *)(pVVar1->m_data + 2);
          local_38c[0] = 1.0 / (float)(1 << (bVar3 & 0x1f));
          local_38c[1] = 1.0 / (float)(int)uVar12;
          if (ABS((float)local_358 - (float)local_348) <= 1.0 / (float)(1 << (bVar2 & 0x1f))) {
            uVar6 = 0;
            do {
              uVar8 = uVar6;
              if (uVar8 == 2) break;
              fVar18 = ABS(*(float *)((long)&local_358 + uVar8 * 4 + 4) -
                           *(float *)((long)&local_348 + uVar8 * 4 + 4));
              uVar6 = uVar8 + 1;
            } while (fVar18 < local_38c[uVar8] || fVar18 == local_38c[uVar8]);
            bVar16 = 1 < uVar8;
          }
          else {
            bVar16 = false;
          }
          if (!bVar16) {
            local_1b8[0] = false;
            local_38c[2] = 1.0 / (float)(1 << (bVar4 & 0x1f));
            std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b8 + 8));
            local_38 = 0xffffffffffffffff;
            local_338[0] = false;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_330);
            DILogger::operator<<((DILogger *)local_338,(char (*) [9])"(x,y)= (");
            if (local_338[0] == false) {
              std::ostream::_M_insert<unsigned_long>((ulong)&local_330);
            }
            DILogger::operator<<((DILogger *)local_338,(char (*) [2])0x1cfbcfd);
            if (local_338[0] == false) {
              std::ostream::_M_insert<unsigned_long>((ulong)&local_330);
            }
            if (local_338[0] == false) {
              std::__ostream_insert<char,std::char_traits<char>>(&local_330,"). Color RGBA(",0xe);
            }
            if (local_338[0] == false) {
              std::ostream::_M_insert<double>
                        ((double)(bufferTest->
                                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start[uVar14].m_data[0]);
            }
            DILogger::operator<<((DILogger *)local_338,(char (*) [2])0x1cfbcfd);
            if (local_338[0] == false) {
              std::ostream::_M_insert<double>
                        ((double)(bufferTest->
                                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start[uVar14].m_data[1]);
            }
            DILogger::operator<<((DILogger *)local_338,(char (*) [2])0x1cfbcfd);
            if (local_338[0] == false) {
              std::ostream::_M_insert<double>
                        ((double)(bufferTest->
                                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start[uVar14].m_data[2]);
            }
            DILogger::operator<<((DILogger *)local_338,(char (*) [2])0x1cfbcfd);
            if (local_338[0] == false) {
              std::ostream::_M_insert<double>
                        ((double)(bufferTest->
                                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start[uVar14].m_data[3]);
            }
            if (local_338[0] == false) {
              std::__ostream_insert<char,std::char_traits<char>>
                        (&local_330,") is different than expected RGBA(",0x22);
            }
            if (local_338[0] == false) {
              std::ostream::_M_insert<double>
                        ((double)(bufferRef->
                                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start[uVar15].m_data[0]);
            }
            DILogger::operator<<((DILogger *)local_338,(char (*) [2])0x1cfbcfd);
            if (local_338[0] == false) {
              std::ostream::_M_insert<double>
                        ((double)(bufferRef->
                                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start[uVar15].m_data[1]);
            }
            DILogger::operator<<((DILogger *)local_338,(char (*) [2])0x1cfbcfd);
            if (local_338[0] == false) {
              std::ostream::_M_insert<double>
                        ((double)(bufferRef->
                                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start[uVar15].m_data[2]);
            }
            DILogger::operator<<((DILogger *)local_338,(char (*) [2])0x1cfbcfd);
            if (local_338[0] == false) {
              std::ostream::_M_insert<double>
                        ((double)(bufferRef->
                                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start[uVar15].m_data[3]);
            }
            DILogger::operator<<((DILogger *)local_338,(char (*) [2])0x1b21de7);
            glcts::anon_unknown_0::DILogger::~DILogger((DILogger *)local_338);
            uVar13 = local_38;
            glcts::anon_unknown_0::DILogger::~DILogger((DILogger *)local_1b8);
            uVar10 = local_368;
            dVar19 = local_370;
          }
          if (!bVar16) break;
          uVar11 = uVar11 + 1;
          bVar17 = uVar11 < local_360;
        } while (uVar11 != local_360);
      }
      if (bVar17) {
        return uVar13;
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 != local_380);
  }
  return 0;
}

Assistant:

long BuffersCompare(const std::vector<T>& bufferTest, unsigned int widthTest, unsigned int heightTest,
						const std::vector<T>& bufferRef, unsigned int widthRef, unsigned int heightRef)
	{

		const tcu::PixelFormat& pixelFormat = m_context.getRenderContext().getRenderTarget().getPixelFormat();
		tcu::Vec4				epsilon		= tcu::Vec4(
			1.f / static_cast<float>(1 << pixelFormat.redBits), 1.f / static_cast<float>(1 << pixelFormat.greenBits),
			1.f / static_cast<float>(1 << pixelFormat.blueBits), 1.f / static_cast<float>(1 << pixelFormat.alphaBits));

		double stepX = widthRef / static_cast<double>(widthTest);
		double stepY = heightRef / static_cast<double>(heightTest);
		for (unsigned int i = 0; i < heightTest; ++i)
		{
			unsigned int offsetTest = i * widthTest;
			unsigned int offsetRef  = static_cast<int>(i * stepY + 0.5) * widthRef;
			for (unsigned int j = 0; j < widthTest; ++j)
			{
				unsigned int posXRef = static_cast<int>(j * stepX + 0.5);
				if (!ColorVerify(bufferTest[j + offsetTest], bufferRef[posXRef + offsetRef], epsilon))
				{
					DIResult status;
					status.error() << "(x,y)= (" << j << "," << i << "). Color RGBA(" << bufferTest[j + offsetTest][0]
								   << "," << bufferTest[j + offsetTest][1] << "," << bufferTest[j + offsetTest][2]
								   << "," << bufferTest[j + offsetTest][3] << ") is different than expected RGBA("
								   << bufferRef[posXRef + offsetRef][0] << "," << bufferRef[posXRef + offsetRef][1]
								   << "," << bufferRef[posXRef + offsetRef][2] << ","
								   << bufferRef[posXRef + offsetRef][3] << ")";
					return status.code();
				}
			}
		}
		return NO_ERROR;
	}